

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  int iVar7;
  undefined4 uVar8;
  float fVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  byte bVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  ulong *puVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  float fVar58;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  float fVar67;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_16e0;
  undefined1 local_16a0 [16];
  long local_1690;
  ulong local_1688;
  long local_1680;
  ulong local_1678;
  RTCFilterFunctionNArguments local_1670;
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  float local_1600;
  float fStack_15fc;
  float fStack_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float fStack_15e8;
  float fStack_15e4;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  undefined1 local_1590 [16];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  RTCHitN local_1490 [16];
  undefined1 local_1480 [16];
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined1 local_1440 [16];
  undefined1 local_1430 [16];
  uint local_1420;
  uint uStack_141c;
  uint uStack_1418;
  uint uStack_1414;
  uint uStack_1410;
  uint uStack_140c;
  uint uStack_1408;
  uint uStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  char local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220;
  size_t local_1200;
  ulong local_11f8 [569];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar32 [16];
  undefined1 auVar87 [64];
  
  local_1200 = root.ptr;
  auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar88 = ZEXT3264(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar89 = ZEXT3264(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar90 = ZEXT3264(auVar34);
  fVar58 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar67 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar76 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar58 * 0.99999964)));
  auVar91 = ZEXT3264(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar67 * 0.99999964)));
  auVar92 = ZEXT3264(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar76 * 0.99999964)));
  auVar93 = ZEXT3264(auVar34);
  fVar58 = fVar58 * 1.0000004;
  fVar67 = fVar67 * 1.0000004;
  fVar76 = fVar76 * 1.0000004;
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1678 = uVar28 ^ 0x20;
  iVar7 = (tray->tnear).field_0.i[k];
  local_1620._4_4_ = iVar7;
  local_1620._0_4_ = iVar7;
  local_1620._8_4_ = iVar7;
  local_1620._12_4_ = iVar7;
  local_1620._16_4_ = iVar7;
  local_1620._20_4_ = iVar7;
  local_1620._24_4_ = iVar7;
  local_1620._28_4_ = iVar7;
  auVar84 = ZEXT3264(local_1620);
  iVar7 = (tray->tfar).field_0.i[k];
  local_1640._4_4_ = iVar7;
  local_1640._0_4_ = iVar7;
  local_1640._8_4_ = iVar7;
  local_1640._12_4_ = iVar7;
  local_1640._16_4_ = iVar7;
  local_1640._20_4_ = iVar7;
  local_1640._24_4_ = iVar7;
  local_1640._28_4_ = iVar7;
  auVar85 = ZEXT3264(local_1640);
  local_1590 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_16e0 = local_11f8;
  fVar61 = fVar58;
  fVar62 = fVar58;
  fVar63 = fVar58;
  fVar64 = fVar58;
  fVar65 = fVar58;
  fVar66 = fVar58;
  fVar70 = fVar67;
  fVar71 = fVar67;
  fVar72 = fVar67;
  fVar73 = fVar67;
  fVar74 = fVar67;
  fVar75 = fVar67;
  fVar77 = fVar76;
  fVar78 = fVar76;
  fVar79 = fVar76;
  fVar80 = fVar76;
  fVar81 = fVar76;
  fVar82 = fVar76;
  local_1600 = fVar76;
  fStack_15fc = fVar76;
  fStack_15f8 = fVar76;
  fStack_15f4 = fVar76;
  fStack_15f0 = fVar76;
  fStack_15ec = fVar76;
  fStack_15e8 = fVar76;
  fStack_15e4 = fVar76;
  local_15e0 = fVar67;
  fStack_15dc = fVar67;
  fStack_15d8 = fVar67;
  fStack_15d4 = fVar67;
  fStack_15d0 = fVar67;
  fStack_15cc = fVar67;
  fStack_15c8 = fVar67;
  fStack_15c4 = fVar67;
  local_15c0 = fVar58;
  fStack_15bc = fVar58;
  fStack_15b8 = fVar58;
  fStack_15b4 = fVar58;
  fStack_15b0 = fVar58;
  fStack_15ac = fVar58;
  fStack_15a8 = fVar58;
  fStack_15a4 = fVar58;
LAB_01db4709:
  do {
    puVar27 = local_16e0;
    if (puVar27 == &local_1200) {
LAB_01db50ba:
      return puVar27 != &local_1200;
    }
    local_16e0 = puVar27 + -1;
    uVar31 = puVar27[-1];
    while ((uVar31 & 8) == 0) {
      auVar34 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar28),auVar88._0_32_);
      auVar34 = vmulps_avx512vl(auVar91._0_32_,auVar34);
      auVar35 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar30),auVar89._0_32_);
      auVar35 = vmulps_avx512vl(auVar92._0_32_,auVar35);
      auVar34 = vmaxps_avx(auVar34,auVar35);
      auVar35 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar29),auVar90._0_32_);
      auVar35 = vmulps_avx512vl(auVar93._0_32_,auVar35);
      auVar35 = vmaxps_avx(auVar35,auVar84._0_32_);
      auVar34 = vmaxps_avx(auVar34,auVar35);
      auVar36 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar31 + 0x40 + local_1678),auVar88._0_32_);
      auVar35._4_4_ = fVar61 * auVar36._4_4_;
      auVar35._0_4_ = fVar58 * auVar36._0_4_;
      auVar35._8_4_ = fVar62 * auVar36._8_4_;
      auVar35._12_4_ = fVar63 * auVar36._12_4_;
      auVar35._16_4_ = fVar64 * auVar36._16_4_;
      auVar35._20_4_ = fVar65 * auVar36._20_4_;
      auVar35._24_4_ = fVar66 * auVar36._24_4_;
      auVar35._28_4_ = auVar36._28_4_;
      auVar37 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar31 + 0x40 + (uVar30 ^ 0x20)),
                                auVar89._0_32_);
      auVar36._4_4_ = fVar70 * auVar37._4_4_;
      auVar36._0_4_ = fVar67 * auVar37._0_4_;
      auVar36._8_4_ = fVar71 * auVar37._8_4_;
      auVar36._12_4_ = fVar72 * auVar37._12_4_;
      auVar36._16_4_ = fVar73 * auVar37._16_4_;
      auVar36._20_4_ = fVar74 * auVar37._20_4_;
      auVar36._24_4_ = fVar75 * auVar37._24_4_;
      auVar36._28_4_ = auVar37._28_4_;
      auVar35 = vminps_avx(auVar35,auVar36);
      auVar36 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar31 + 0x40 + (uVar29 ^ 0x20)),
                                auVar90._0_32_);
      auVar37._4_4_ = fVar77 * auVar36._4_4_;
      auVar37._0_4_ = fVar76 * auVar36._0_4_;
      auVar37._8_4_ = fVar78 * auVar36._8_4_;
      auVar37._12_4_ = fVar79 * auVar36._12_4_;
      auVar37._16_4_ = fVar80 * auVar36._16_4_;
      auVar37._20_4_ = fVar81 * auVar36._20_4_;
      auVar37._24_4_ = fVar82 * auVar36._24_4_;
      auVar37._28_4_ = auVar36._28_4_;
      auVar36 = vminps_avx(auVar37,auVar85._0_32_);
      auVar35 = vminps_avx(auVar35,auVar36);
      uVar26 = vcmpps_avx512vl(auVar34,auVar35,2);
      if ((char)uVar26 == '\0') goto LAB_01db4709;
      uVar23 = uVar31 & 0xfffffffffffffff0;
      lVar18 = 0;
      for (uVar31 = uVar26; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar31 = *(ulong *)(uVar23 + lVar18 * 8);
      uVar25 = (uint)uVar26 - 1 & (uint)uVar26;
      uVar26 = (ulong)uVar25;
      if (uVar25 != 0) {
        do {
          *local_16e0 = uVar31;
          local_16e0 = local_16e0 + 1;
          lVar18 = 0;
          for (uVar31 = uVar26; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar26 = uVar26 - 1 & uVar26;
          uVar31 = *(ulong *)(uVar23 + lVar18 * 8);
        } while (uVar26 != 0);
      }
    }
    local_1680 = (ulong)((uint)uVar31 & 0xf) - 8;
    uVar31 = uVar31 & 0xfffffffffffffff0;
    for (local_1690 = 0; local_1690 != local_1680; local_1690 = local_1690 + 1) {
      lVar24 = local_1690 * 0xe0;
      lVar18 = uVar31 + 0xd0 + lVar24;
      local_1400 = *(undefined8 *)(lVar18 + 0x10);
      uStack_13f8 = *(undefined8 *)(lVar18 + 0x18);
      lVar18 = uVar31 + 0xc0 + lVar24;
      local_13e0 = *(undefined8 *)(lVar18 + 0x10);
      uStack_13d8 = *(undefined8 *)(lVar18 + 0x18);
      uStack_13d0 = local_13e0;
      uStack_13c8 = uStack_13d8;
      uStack_13f0 = local_1400;
      uStack_13e8 = uStack_13f8;
      auVar34._16_16_ = *(undefined1 (*) [16])(uVar31 + 0x60 + lVar24);
      auVar34._0_16_ = *(undefined1 (*) [16])(uVar31 + lVar24);
      auVar38._16_16_ = *(undefined1 (*) [16])(uVar31 + 0x70 + lVar24);
      auVar38._0_16_ = *(undefined1 (*) [16])(uVar31 + 0x10 + lVar24);
      auVar39._16_16_ = *(undefined1 (*) [16])(uVar31 + 0x80 + lVar24);
      auVar39._0_16_ = *(undefined1 (*) [16])(uVar31 + 0x20 + lVar24);
      auVar33 = *(undefined1 (*) [16])(uVar31 + 0x30 + lVar24);
      auVar44._16_16_ = auVar33;
      auVar44._0_16_ = auVar33;
      auVar33 = *(undefined1 (*) [16])(uVar31 + 0x40 + lVar24);
      auVar45._16_16_ = auVar33;
      auVar45._0_16_ = auVar33;
      auVar33 = *(undefined1 (*) [16])(uVar31 + 0x50 + lVar24);
      auVar46._16_16_ = auVar33;
      auVar46._0_16_ = auVar33;
      auVar33 = *(undefined1 (*) [16])(uVar31 + 0x90 + lVar24);
      auVar47._16_16_ = auVar33;
      auVar47._0_16_ = auVar33;
      auVar33 = *(undefined1 (*) [16])(uVar31 + 0xa0 + lVar24);
      auVar48._16_16_ = auVar33;
      auVar48._0_16_ = auVar33;
      auVar33 = *(undefined1 (*) [16])(uVar31 + 0xb0 + lVar24);
      auVar49._16_16_ = auVar33;
      auVar49._0_16_ = auVar33;
      uVar8 = *(undefined4 *)(ray + k * 4);
      auVar50._4_4_ = uVar8;
      auVar50._0_4_ = uVar8;
      auVar50._8_4_ = uVar8;
      auVar50._12_4_ = uVar8;
      auVar50._16_4_ = uVar8;
      auVar50._20_4_ = uVar8;
      auVar50._24_4_ = uVar8;
      auVar50._28_4_ = uVar8;
      auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
      auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar59._4_4_ = uVar8;
      auVar59._0_4_ = uVar8;
      auVar59._8_4_ = uVar8;
      auVar59._12_4_ = uVar8;
      auVar59._16_4_ = uVar8;
      auVar59._20_4_ = uVar8;
      auVar59._24_4_ = uVar8;
      auVar59._28_4_ = uVar8;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar68._4_4_ = uVar8;
      auVar68._0_4_ = uVar8;
      auVar68._8_4_ = uVar8;
      auVar68._12_4_ = uVar8;
      auVar68._16_4_ = uVar8;
      auVar68._20_4_ = uVar8;
      auVar68._24_4_ = uVar8;
      auVar68._28_4_ = uVar8;
      fVar9 = *(float *)(ray + k * 4 + 0x60);
      auVar83._4_4_ = fVar9;
      auVar83._0_4_ = fVar9;
      auVar83._8_4_ = fVar9;
      auVar83._12_4_ = fVar9;
      auVar83._16_4_ = fVar9;
      auVar83._20_4_ = fVar9;
      auVar83._24_4_ = fVar9;
      auVar83._28_4_ = fVar9;
      auVar34 = vsubps_avx(auVar34,auVar50);
      auVar38 = vsubps_avx512vl(auVar38,auVar36);
      auVar39 = vsubps_avx512vl(auVar39,auVar37);
      auVar40 = vsubps_avx512vl(auVar44,auVar50);
      auVar41 = vsubps_avx512vl(auVar45,auVar36);
      auVar42 = vsubps_avx512vl(auVar46,auVar37);
      auVar35 = vsubps_avx(auVar47,auVar50);
      auVar43 = vsubps_avx512vl(auVar48,auVar36);
      auVar44 = vsubps_avx512vl(auVar49,auVar37);
      auVar36 = vsubps_avx(auVar35,auVar34);
      auVar45 = vsubps_avx512vl(auVar43,auVar38);
      auVar37 = vsubps_avx(auVar44,auVar39);
      auVar46 = vsubps_avx512vl(auVar34,auVar40);
      auVar47 = vsubps_avx512vl(auVar38,auVar41);
      auVar48 = vsubps_avx512vl(auVar39,auVar42);
      auVar49 = vsubps_avx512vl(auVar40,auVar35);
      auVar50 = vsubps_avx512vl(auVar41,auVar43);
      auVar51 = vsubps_avx512vl(auVar42,auVar44);
      auVar56._0_4_ = auVar35._0_4_ + auVar34._0_4_;
      auVar56._4_4_ = auVar35._4_4_ + auVar34._4_4_;
      auVar56._8_4_ = auVar35._8_4_ + auVar34._8_4_;
      auVar56._12_4_ = auVar35._12_4_ + auVar34._12_4_;
      auVar56._16_4_ = auVar35._16_4_ + auVar34._16_4_;
      auVar56._20_4_ = auVar35._20_4_ + auVar34._20_4_;
      auVar56._24_4_ = auVar35._24_4_ + auVar34._24_4_;
      auVar56._28_4_ = auVar35._28_4_ + auVar34._28_4_;
      auVar52 = vaddps_avx512vl(auVar43,auVar38);
      auVar53 = vaddps_avx512vl(auVar44,auVar39);
      auVar54 = vmulps_avx512vl(auVar52,auVar37);
      auVar54 = vfmsub231ps_avx512vl(auVar54,auVar45,auVar53);
      auVar53 = vmulps_avx512vl(auVar53,auVar36);
      auVar55 = vfmsub231ps_avx512vl(auVar53,auVar37,auVar56);
      auVar53._4_4_ = auVar45._4_4_ * auVar56._4_4_;
      auVar53._0_4_ = auVar45._0_4_ * auVar56._0_4_;
      auVar53._8_4_ = auVar45._8_4_ * auVar56._8_4_;
      auVar53._12_4_ = auVar45._12_4_ * auVar56._12_4_;
      auVar53._16_4_ = auVar45._16_4_ * auVar56._16_4_;
      auVar53._20_4_ = auVar45._20_4_ * auVar56._20_4_;
      auVar53._24_4_ = auVar45._24_4_ * auVar56._24_4_;
      auVar53._28_4_ = auVar56._28_4_;
      auVar33 = vfmsub231ps_fma(auVar53,auVar36,auVar52);
      auVar57._0_4_ = fVar9 * auVar33._0_4_;
      auVar57._4_4_ = fVar9 * auVar33._4_4_;
      auVar57._8_4_ = fVar9 * auVar33._8_4_;
      auVar57._12_4_ = fVar9 * auVar33._12_4_;
      auVar57._16_4_ = fVar9 * 0.0;
      auVar57._20_4_ = fVar9 * 0.0;
      auVar57._24_4_ = fVar9 * 0.0;
      auVar57._28_4_ = 0;
      auVar53 = vfmadd231ps_avx512vl(auVar57,auVar68,auVar55);
      local_13c0 = vfmadd231ps_avx512vl(auVar53,auVar59,auVar54);
      auVar53 = vaddps_avx512vl(auVar34,auVar40);
      auVar52 = vaddps_avx512vl(auVar38,auVar41);
      auVar54 = vaddps_avx512vl(auVar39,auVar42);
      auVar55 = vmulps_avx512vl(auVar52,auVar48);
      auVar55 = vfmsub231ps_avx512vl(auVar55,auVar47,auVar54);
      auVar54 = vmulps_avx512vl(auVar54,auVar46);
      auVar54 = vfmsub231ps_avx512vl(auVar54,auVar48,auVar53);
      auVar53 = vmulps_avx512vl(auVar53,auVar47);
      auVar53 = vfmsub231ps_avx512vl(auVar53,auVar46,auVar52);
      auVar52._4_4_ = fVar9 * auVar53._4_4_;
      auVar52._0_4_ = fVar9 * auVar53._0_4_;
      auVar52._8_4_ = fVar9 * auVar53._8_4_;
      auVar52._12_4_ = fVar9 * auVar53._12_4_;
      auVar52._16_4_ = fVar9 * auVar53._16_4_;
      auVar52._20_4_ = fVar9 * auVar53._20_4_;
      auVar52._24_4_ = fVar9 * auVar53._24_4_;
      auVar52._28_4_ = auVar53._28_4_;
      auVar53 = vfmadd231ps_avx512vl(auVar52,auVar68,auVar54);
      local_13a0 = vfmadd231ps_avx512vl(auVar53,auVar59,auVar55);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar35 = vaddps_avx512vl(auVar40,auVar35);
      auVar40 = vaddps_avx512vl(auVar41,auVar43);
      auVar41 = vaddps_avx512vl(auVar42,auVar44);
      auVar52 = vmulps_avx512vl(auVar40,auVar51);
      auVar52 = vfmsub231ps_avx512vl(auVar52,auVar50,auVar41);
      auVar42._4_4_ = auVar41._4_4_ * auVar49._4_4_;
      auVar42._0_4_ = auVar41._0_4_ * auVar49._0_4_;
      auVar42._8_4_ = auVar41._8_4_ * auVar49._8_4_;
      auVar42._12_4_ = auVar41._12_4_ * auVar49._12_4_;
      auVar42._16_4_ = auVar41._16_4_ * auVar49._16_4_;
      auVar42._20_4_ = auVar41._20_4_ * auVar49._20_4_;
      auVar42._24_4_ = auVar41._24_4_ * auVar49._24_4_;
      auVar42._28_4_ = auVar41._28_4_;
      auVar33 = vfmsub231ps_fma(auVar42,auVar51,auVar35);
      auVar43._4_4_ = auVar35._4_4_ * auVar50._4_4_;
      auVar43._0_4_ = auVar35._0_4_ * auVar50._0_4_;
      auVar43._8_4_ = auVar35._8_4_ * auVar50._8_4_;
      auVar43._12_4_ = auVar35._12_4_ * auVar50._12_4_;
      auVar43._16_4_ = auVar35._16_4_ * auVar50._16_4_;
      auVar43._20_4_ = auVar35._20_4_ * auVar50._20_4_;
      auVar43._24_4_ = auVar35._24_4_ * auVar50._24_4_;
      auVar43._28_4_ = auVar35._28_4_;
      auVar35 = vfmsub231ps_avx512vl(auVar43,auVar49,auVar40);
      auVar35 = vmulps_avx512vl(auVar35,auVar83);
      auVar35 = vfmadd231ps_avx512vl(auVar35,auVar68,ZEXT1632(auVar33));
      auVar35 = vfmadd231ps_avx512vl(auVar35,auVar59,auVar52);
      auVar54._0_4_ = local_13c0._0_4_ + local_13a0._0_4_;
      auVar54._4_4_ = local_13c0._4_4_ + local_13a0._4_4_;
      auVar54._8_4_ = local_13c0._8_4_ + local_13a0._8_4_;
      auVar54._12_4_ = local_13c0._12_4_ + local_13a0._12_4_;
      auVar54._16_4_ = local_13c0._16_4_ + local_13a0._16_4_;
      auVar54._20_4_ = local_13c0._20_4_ + local_13a0._20_4_;
      auVar54._24_4_ = local_13c0._24_4_ + local_13a0._24_4_;
      auVar54._28_4_ = local_13c0._28_4_ + local_13a0._28_4_;
      local_1380 = vaddps_avx512vl(auVar35,auVar54);
      vandps_avx512vl(local_1380,auVar53);
      auVar40._8_4_ = 0x34000000;
      auVar40._0_8_ = 0x3400000034000000;
      auVar40._12_4_ = 0x34000000;
      auVar40._16_4_ = 0x34000000;
      auVar40._20_4_ = 0x34000000;
      auVar40._24_4_ = 0x34000000;
      auVar40._28_4_ = 0x34000000;
      auVar40 = vmulps_avx512vl(local_1380,auVar40);
      auVar41 = vminps_avx512vl(local_13c0,local_13a0);
      auVar52 = vminps_avx512vl(auVar41,auVar35);
      auVar41._8_4_ = 0x80000000;
      auVar41._0_8_ = 0x8000000080000000;
      auVar41._12_4_ = 0x80000000;
      auVar41._16_4_ = 0x80000000;
      auVar41._20_4_ = 0x80000000;
      auVar41._24_4_ = 0x80000000;
      auVar41._28_4_ = 0x80000000;
      auVar41 = vxorps_avx512vl(auVar40,auVar41);
      uVar14 = vcmpps_avx512vl(auVar52,auVar41,5);
      auVar41 = vmaxps_avx512vl(local_13c0,local_13a0);
      auVar35 = vmaxps_avx512vl(auVar41,auVar35);
      uVar15 = vcmpps_avx512vl(auVar35,auVar40,2);
      bVar17 = (byte)uVar14 | (byte)uVar15;
      fVar61 = fStack_15bc;
      fVar62 = fStack_15b8;
      fVar63 = fStack_15b4;
      fVar64 = fStack_15b0;
      fVar65 = fStack_15ac;
      fVar66 = fStack_15a8;
      fVar58 = local_15c0;
      fVar70 = fStack_15dc;
      fVar71 = fStack_15d8;
      fVar72 = fStack_15d4;
      fVar73 = fStack_15d0;
      fVar74 = fStack_15cc;
      fVar75 = fStack_15c8;
      fVar67 = local_15e0;
      fVar77 = fStack_15fc;
      fVar78 = fStack_15f8;
      fVar79 = fStack_15f4;
      fVar80 = fStack_15f0;
      fVar81 = fStack_15ec;
      fVar82 = fStack_15e8;
      fVar76 = local_1600;
      if (bVar17 == 0) {
LAB_01db5060:
        auVar84 = ZEXT3264(local_1620);
        auVar85 = ZEXT3264(local_1640);
      }
      else {
        auVar35 = vmulps_avx512vl(auVar47,auVar37);
        auVar40 = vmulps_avx512vl(auVar36,auVar48);
        auVar41 = vmulps_avx512vl(auVar46,auVar45);
        auVar52 = vmulps_avx512vl(auVar50,auVar48);
        auVar42 = vmulps_avx512vl(auVar46,auVar51);
        auVar43 = vmulps_avx512vl(auVar49,auVar47);
        auVar44 = vfmsub213ps_avx512vl(auVar45,auVar48,auVar35);
        auVar37 = vfmsub213ps_avx512vl(auVar37,auVar46,auVar40);
        auVar36 = vfmsub213ps_avx512vl(auVar36,auVar47,auVar41);
        auVar45 = vfmsub213ps_avx512vl(auVar51,auVar47,auVar52);
        auVar47 = vfmsub213ps_avx512vl(auVar49,auVar48,auVar42);
        auVar46 = vfmsub213ps_avx512vl(auVar50,auVar46,auVar43);
        vandps_avx512vl(auVar35,auVar53);
        vandps_avx512vl(auVar52,auVar53);
        uVar26 = vcmpps_avx512vl(auVar46,auVar46,1);
        vandps_avx512vl(auVar40,auVar53);
        vandps_avx512vl(auVar42,auVar53);
        uVar23 = vcmpps_avx512vl(auVar46,auVar46,1);
        vandps_avx512vl(auVar41,auVar53);
        vandps_avx512vl(auVar43,auVar53);
        uVar16 = vcmpps_avx512vl(auVar46,auVar46,1);
        bVar13 = (bool)((byte)uVar26 & 1);
        local_1360._0_4_ = (float)((uint)bVar13 * auVar44._0_4_ | (uint)!bVar13 * auVar45._0_4_);
        bVar13 = (bool)((byte)(uVar26 >> 1) & 1);
        local_1360._4_4_ = (float)((uint)bVar13 * auVar44._4_4_ | (uint)!bVar13 * auVar45._4_4_);
        bVar13 = (bool)((byte)(uVar26 >> 2) & 1);
        local_1360._8_4_ = (float)((uint)bVar13 * auVar44._8_4_ | (uint)!bVar13 * auVar45._8_4_);
        bVar13 = (bool)((byte)(uVar26 >> 3) & 1);
        local_1360._12_4_ = (float)((uint)bVar13 * auVar44._12_4_ | (uint)!bVar13 * auVar45._12_4_);
        bVar13 = (bool)((byte)(uVar26 >> 4) & 1);
        local_1360._16_4_ = (float)((uint)bVar13 * auVar44._16_4_ | (uint)!bVar13 * auVar45._16_4_);
        bVar13 = (bool)((byte)(uVar26 >> 5) & 1);
        local_1360._20_4_ = (float)((uint)bVar13 * auVar44._20_4_ | (uint)!bVar13 * auVar45._20_4_);
        bVar13 = (bool)((byte)(uVar26 >> 6) & 1);
        local_1360._24_4_ = (float)((uint)bVar13 * auVar44._24_4_ | (uint)!bVar13 * auVar45._24_4_);
        bVar13 = SUB81(uVar26 >> 7,0);
        local_1360._28_4_ = (uint)bVar13 * auVar44._28_4_ | (uint)!bVar13 * auVar45._28_4_;
        bVar13 = (bool)((byte)uVar23 & 1);
        local_1340._0_4_ = (float)((uint)bVar13 * auVar37._0_4_ | (uint)!bVar13 * auVar47._0_4_);
        bVar13 = (bool)((byte)(uVar23 >> 1) & 1);
        local_1340._4_4_ = (float)((uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar47._4_4_);
        bVar13 = (bool)((byte)(uVar23 >> 2) & 1);
        local_1340._8_4_ = (float)((uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar47._8_4_);
        bVar13 = (bool)((byte)(uVar23 >> 3) & 1);
        local_1340._12_4_ = (float)((uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar47._12_4_);
        bVar13 = (bool)((byte)(uVar23 >> 4) & 1);
        local_1340._16_4_ = (float)((uint)bVar13 * auVar37._16_4_ | (uint)!bVar13 * auVar47._16_4_);
        bVar13 = (bool)((byte)(uVar23 >> 5) & 1);
        local_1340._20_4_ = (float)((uint)bVar13 * auVar37._20_4_ | (uint)!bVar13 * auVar47._20_4_);
        bVar13 = (bool)((byte)(uVar23 >> 6) & 1);
        local_1340._24_4_ = (float)((uint)bVar13 * auVar37._24_4_ | (uint)!bVar13 * auVar47._24_4_);
        bVar13 = SUB81(uVar23 >> 7,0);
        local_1340._28_4_ = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * auVar47._28_4_;
        bVar13 = (bool)((byte)uVar16 & 1);
        local_1320._0_4_ = (float)((uint)bVar13 * auVar36._0_4_ | (uint)!bVar13 * auVar46._0_4_);
        bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
        local_1320._4_4_ = (float)((uint)bVar13 * auVar36._4_4_ | (uint)!bVar13 * auVar46._4_4_);
        bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
        local_1320._8_4_ = (float)((uint)bVar13 * auVar36._8_4_ | (uint)!bVar13 * auVar46._8_4_);
        bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
        local_1320._12_4_ = (float)((uint)bVar13 * auVar36._12_4_ | (uint)!bVar13 * auVar46._12_4_);
        bVar13 = (bool)((byte)(uVar16 >> 4) & 1);
        local_1320._16_4_ = (float)((uint)bVar13 * auVar36._16_4_ | (uint)!bVar13 * auVar46._16_4_);
        bVar13 = (bool)((byte)(uVar16 >> 5) & 1);
        local_1320._20_4_ = (float)((uint)bVar13 * auVar36._20_4_ | (uint)!bVar13 * auVar46._20_4_);
        bVar13 = (bool)((byte)(uVar16 >> 6) & 1);
        local_1320._24_4_ = (float)((uint)bVar13 * auVar36._24_4_ | (uint)!bVar13 * auVar46._24_4_);
        bVar13 = SUB81(uVar16 >> 7,0);
        local_1320._28_4_ = (uint)bVar13 * auVar36._28_4_ | (uint)!bVar13 * auVar46._28_4_;
        auVar20._4_4_ = fVar9 * local_1320._4_4_;
        auVar20._0_4_ = fVar9 * local_1320._0_4_;
        auVar20._8_4_ = fVar9 * local_1320._8_4_;
        auVar20._12_4_ = fVar9 * local_1320._12_4_;
        auVar20._16_4_ = fVar9 * local_1320._16_4_;
        auVar20._20_4_ = fVar9 * local_1320._20_4_;
        auVar20._24_4_ = fVar9 * local_1320._24_4_;
        auVar20._28_4_ = fVar9;
        auVar33 = vfmadd213ps_fma(auVar68,local_1340,auVar20);
        auVar33 = vfmadd213ps_fma(auVar59,local_1360,ZEXT1632(auVar33));
        auVar36 = ZEXT1632(CONCAT412(auVar33._12_4_ + auVar33._12_4_,
                                     CONCAT48(auVar33._8_4_ + auVar33._8_4_,
                                              CONCAT44(auVar33._4_4_ + auVar33._4_4_,
                                                       auVar33._0_4_ + auVar33._0_4_))));
        auVar69._0_4_ = auVar39._0_4_ * local_1320._0_4_;
        auVar69._4_4_ = auVar39._4_4_ * local_1320._4_4_;
        auVar69._8_4_ = auVar39._8_4_ * local_1320._8_4_;
        auVar69._12_4_ = auVar39._12_4_ * local_1320._12_4_;
        auVar69._16_4_ = auVar39._16_4_ * local_1320._16_4_;
        auVar69._20_4_ = auVar39._20_4_ * local_1320._20_4_;
        auVar69._24_4_ = auVar39._24_4_ * local_1320._24_4_;
        auVar69._28_4_ = 0;
        auVar33 = vfmadd213ps_fma(auVar38,local_1340,auVar69);
        auVar32 = vfmadd213ps_fma(auVar34,local_1360,ZEXT1632(auVar33));
        auVar34 = vrcp14ps_avx512vl(auVar36);
        auVar51._8_4_ = 0x3f800000;
        auVar51._0_8_ = 0x3f8000003f800000;
        auVar51._12_4_ = 0x3f800000;
        auVar51._16_4_ = 0x3f800000;
        auVar51._20_4_ = 0x3f800000;
        auVar51._24_4_ = 0x3f800000;
        auVar51._28_4_ = 0x3f800000;
        auVar35 = vfnmadd213ps_avx512vl(auVar34,auVar36,auVar51);
        auVar33 = vfmadd132ps_fma(auVar35,auVar34,auVar34);
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar86._4_4_ = uVar8;
        auVar86._0_4_ = uVar8;
        auVar86._8_4_ = uVar8;
        auVar86._12_4_ = uVar8;
        auVar86._16_4_ = uVar8;
        auVar86._20_4_ = uVar8;
        auVar86._24_4_ = uVar8;
        auVar86._28_4_ = uVar8;
        auVar87 = ZEXT3264(auVar86);
        local_12a0 = ZEXT1632(CONCAT412(auVar33._12_4_ * (auVar32._12_4_ + auVar32._12_4_),
                                        CONCAT48(auVar33._8_4_ * (auVar32._8_4_ + auVar32._8_4_),
                                                 CONCAT44(auVar33._4_4_ *
                                                          (auVar32._4_4_ + auVar32._4_4_),
                                                          auVar33._0_4_ *
                                                          (auVar32._0_4_ + auVar32._0_4_)))));
        uVar14 = vcmpps_avx512vl(local_12a0,auVar86,2);
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar55._4_4_ = uVar8;
        auVar55._0_4_ = uVar8;
        auVar55._8_4_ = uVar8;
        auVar55._12_4_ = uVar8;
        auVar55._16_4_ = uVar8;
        auVar55._20_4_ = uVar8;
        auVar55._24_4_ = uVar8;
        auVar55._28_4_ = uVar8;
        uVar15 = vcmpps_avx512vl(local_12a0,auVar55,0xd);
        bVar17 = (byte)uVar14 & (byte)uVar15 & bVar17;
        if (bVar17 == 0) goto LAB_01db5060;
        local_1688 = vcmpps_avx512vl(auVar36,_DAT_01f7b000,4);
        local_1688 = bVar17 & local_1688;
        if ((char)local_1688 == '\0') goto LAB_01db5060;
        local_1300 = (char)local_1688;
        local_1220 = 0xf0;
        pSVar10 = context->scene;
        auVar19._8_4_ = 0x219392ef;
        auVar19._0_8_ = 0x219392ef219392ef;
        auVar19._12_4_ = 0x219392ef;
        auVar19._16_4_ = 0x219392ef;
        auVar19._20_4_ = 0x219392ef;
        auVar19._24_4_ = 0x219392ef;
        auVar19._28_4_ = 0x219392ef;
        uVar26 = vcmpps_avx512vl(local_1380,auVar19,5);
        auVar35 = vrcp14ps_avx512vl(local_1380);
        auVar60._8_4_ = 0x3f800000;
        auVar60._0_8_ = 0x3f8000003f800000;
        auVar60._12_4_ = 0x3f800000;
        auVar60._16_4_ = 0x3f800000;
        auVar60._20_4_ = 0x3f800000;
        auVar60._24_4_ = 0x3f800000;
        auVar60._28_4_ = 0x3f800000;
        auVar33 = vfnmadd213ps_fma(local_1380,auVar35,auVar60);
        auVar34 = vfmadd132ps_avx512vl(ZEXT1632(auVar33),auVar35,auVar35);
        fVar1 = (float)((uint)((byte)uVar26 & 1) * auVar34._0_4_);
        fVar2 = (float)((uint)((byte)(uVar26 >> 1) & 1) * auVar34._4_4_);
        fVar3 = (float)((uint)((byte)(uVar26 >> 2) & 1) * auVar34._8_4_);
        fVar4 = (float)((uint)((byte)(uVar26 >> 3) & 1) * auVar34._12_4_);
        fVar5 = (float)((uint)((byte)(uVar26 >> 4) & 1) * auVar34._16_4_);
        fVar6 = (float)((uint)((byte)(uVar26 >> 5) & 1) * auVar34._20_4_);
        fVar9 = (float)((uint)((byte)(uVar26 >> 6) & 1) * auVar34._24_4_);
        auVar21._4_4_ = fVar2 * local_13c0._4_4_;
        auVar21._0_4_ = fVar1 * local_13c0._0_4_;
        auVar21._8_4_ = fVar3 * local_13c0._8_4_;
        auVar21._12_4_ = fVar4 * local_13c0._12_4_;
        auVar21._16_4_ = fVar5 * local_13c0._16_4_;
        auVar21._20_4_ = fVar6 * local_13c0._20_4_;
        auVar21._24_4_ = fVar9 * local_13c0._24_4_;
        auVar21._28_4_ = local_13c0._28_4_;
        auVar34 = vminps_avx(auVar21,auVar60);
        auVar22._4_4_ = fVar2 * local_13a0._4_4_;
        auVar22._0_4_ = fVar1 * local_13a0._0_4_;
        auVar22._8_4_ = fVar3 * local_13a0._8_4_;
        auVar22._12_4_ = fVar4 * local_13a0._12_4_;
        auVar22._16_4_ = fVar5 * local_13a0._16_4_;
        auVar22._20_4_ = fVar6 * local_13a0._20_4_;
        auVar22._24_4_ = fVar9 * local_13a0._24_4_;
        auVar22._28_4_ = auVar35._28_4_;
        auVar35 = vminps_avx(auVar22,auVar60);
        auVar36 = vsubps_avx(auVar60,auVar34);
        auVar37 = vsubps_avx(auVar60,auVar35);
        local_12c0 = vblendps_avx(auVar35,auVar36,0xf0);
        local_12e0 = vblendps_avx(auVar34,auVar37,0xf0);
        fVar9 = (float)DAT_01fbac00;
        fVar6 = DAT_01fbac00._4_4_;
        local_1280._4_4_ = local_1360._4_4_ * fVar6;
        local_1280._0_4_ = local_1360._0_4_ * fVar9;
        fVar5 = DAT_01fbac00._8_4_;
        local_1280._8_4_ = local_1360._8_4_ * fVar5;
        fVar4 = DAT_01fbac00._12_4_;
        local_1280._12_4_ = local_1360._12_4_ * fVar4;
        fVar3 = DAT_01fbac00._16_4_;
        local_1280._16_4_ = local_1360._16_4_ * fVar3;
        fVar2 = DAT_01fbac00._20_4_;
        local_1280._20_4_ = local_1360._20_4_ * fVar2;
        fVar1 = DAT_01fbac00._24_4_;
        local_1280._24_4_ = local_1360._24_4_ * fVar1;
        local_1280._28_4_ = local_1360._28_4_;
        local_1260._4_4_ = local_1340._4_4_ * fVar6;
        local_1260._0_4_ = local_1340._0_4_ * fVar9;
        local_1260._8_4_ = local_1340._8_4_ * fVar5;
        local_1260._12_4_ = local_1340._12_4_ * fVar4;
        local_1260._16_4_ = local_1340._16_4_ * fVar3;
        local_1260._20_4_ = local_1340._20_4_ * fVar2;
        local_1260._24_4_ = local_1340._24_4_ * fVar1;
        local_1260._28_4_ = local_1340._28_4_;
        local_1240._4_4_ = local_1320._4_4_ * fVar6;
        local_1240._0_4_ = local_1320._0_4_ * fVar9;
        local_1240._8_4_ = local_1320._8_4_ * fVar5;
        local_1240._12_4_ = local_1320._12_4_ * fVar4;
        local_1240._16_4_ = local_1320._16_4_ * fVar3;
        local_1240._20_4_ = local_1320._20_4_ * fVar2;
        local_1240._24_4_ = local_1320._24_4_ * fVar1;
        local_1240._28_4_ = local_1320._28_4_;
        auVar84 = ZEXT3264(local_1620);
        auVar85 = ZEXT3264(local_1640);
        do {
          local_14c0 = auVar88._0_32_;
          uVar26 = 0;
          for (uVar23 = local_1688; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
            uVar26 = uVar26 + 1;
          }
          pGVar11 = (pSVar10->geometries).items[*(uint *)((long)&local_13e0 + uVar26 * 4)].ptr;
          if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            local_1688 = local_1688 ^ 1L << (uVar26 & 0x3f);
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01db50a6:
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_01db50ba;
            }
            uVar23 = (ulong)(uint)((int)uVar26 * 4);
            uVar8 = *(undefined4 *)(local_12e0 + uVar23);
            local_1460._4_4_ = uVar8;
            local_1460._0_4_ = uVar8;
            local_1460._8_4_ = uVar8;
            local_1460._12_4_ = uVar8;
            uVar8 = *(undefined4 *)(local_12c0 + uVar23);
            local_1450._4_4_ = uVar8;
            local_1450._0_4_ = uVar8;
            local_1450._8_4_ = uVar8;
            local_1450._12_4_ = uVar8;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12a0 + uVar23);
            local_1670.context = context->user;
            local_1430 = vpbroadcastd_avx512vl();
            uVar8 = *(undefined4 *)((long)&local_1400 + uVar23);
            local_1440._4_4_ = uVar8;
            local_1440._0_4_ = uVar8;
            local_1440._8_4_ = uVar8;
            local_1440._12_4_ = uVar8;
            uVar8 = *(undefined4 *)(local_1280 + uVar23);
            local_1490._4_4_ = uVar8;
            local_1490._0_4_ = uVar8;
            local_1490._8_4_ = uVar8;
            local_1490._12_4_ = uVar8;
            uVar8 = *(undefined4 *)(local_1260 + uVar23);
            local_1480._4_4_ = uVar8;
            local_1480._0_4_ = uVar8;
            local_1480._8_4_ = uVar8;
            local_1480._12_4_ = uVar8;
            uVar8 = *(undefined4 *)(local_1240 + uVar23);
            local_1470._4_4_ = uVar8;
            local_1470._0_4_ = uVar8;
            local_1470._8_4_ = uVar8;
            local_1470._12_4_ = uVar8;
            vpcmpeqd_avx2(ZEXT1632(local_1430),ZEXT1632(local_1430));
            uStack_141c = (local_1670.context)->instID[0];
            local_1420 = uStack_141c;
            uStack_1418 = uStack_141c;
            uStack_1414 = uStack_141c;
            uStack_1410 = (local_1670.context)->instPrimID[0];
            uStack_140c = uStack_1410;
            uStack_1408 = uStack_1410;
            uStack_1404 = uStack_1410;
            local_16a0 = local_1590;
            local_1670.valid = (int *)local_16a0;
            local_1670.geometryUserPtr = pGVar11->userPtr;
            local_1670.hit = local_1490;
            local_1670.N = 4;
            local_14e0 = auVar89._0_32_;
            local_1500 = auVar90._0_32_;
            local_1520 = auVar91._0_32_;
            local_1540 = auVar92._0_32_;
            local_1560 = auVar93._0_32_;
            local_1580 = auVar87._0_32_;
            local_1670.ray = (RTCRayN *)ray;
            if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar11->occlusionFilterN)(&local_1670);
              auVar87 = ZEXT3264(local_1580);
              auVar85 = ZEXT3264(local_1640);
              auVar84 = ZEXT3264(local_1620);
              auVar93 = ZEXT3264(local_1560);
              auVar92 = ZEXT3264(local_1540);
              auVar91 = ZEXT3264(local_1520);
              auVar90 = ZEXT3264(local_1500);
              auVar89 = ZEXT3264(local_14e0);
              auVar88 = ZEXT3264(local_14c0);
              fVar58 = local_15c0;
              fVar61 = fStack_15bc;
              fVar62 = fStack_15b8;
              fVar63 = fStack_15b4;
              fVar64 = fStack_15b0;
              fVar65 = fStack_15ac;
              fVar66 = fStack_15a8;
              fVar67 = local_15e0;
              fVar70 = fStack_15dc;
              fVar71 = fStack_15d8;
              fVar72 = fStack_15d4;
              fVar73 = fStack_15d0;
              fVar74 = fStack_15cc;
              fVar75 = fStack_15c8;
              fVar76 = local_1600;
              fVar77 = fStack_15fc;
              fVar78 = fStack_15f8;
              fVar79 = fStack_15f4;
              fVar80 = fStack_15f0;
              fVar81 = fStack_15ec;
              fVar82 = fStack_15e8;
            }
            uVar23 = vptestmd_avx512vl(local_16a0,local_16a0);
            if ((uVar23 & 0xf) != 0) {
              p_Var12 = context->args->filter;
              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0))))
              {
                (*p_Var12)(&local_1670);
                auVar87 = ZEXT3264(local_1580);
                auVar85 = ZEXT3264(local_1640);
                auVar84 = ZEXT3264(local_1620);
                auVar93 = ZEXT3264(local_1560);
                auVar92 = ZEXT3264(local_1540);
                auVar91 = ZEXT3264(local_1520);
                auVar90 = ZEXT3264(local_1500);
                auVar89 = ZEXT3264(local_14e0);
                auVar88 = ZEXT3264(local_14c0);
                fVar58 = local_15c0;
                fVar61 = fStack_15bc;
                fVar62 = fStack_15b8;
                fVar63 = fStack_15b4;
                fVar64 = fStack_15b0;
                fVar65 = fStack_15ac;
                fVar66 = fStack_15a8;
                fVar67 = local_15e0;
                fVar70 = fStack_15dc;
                fVar71 = fStack_15d8;
                fVar72 = fStack_15d4;
                fVar73 = fStack_15d0;
                fVar74 = fStack_15cc;
                fVar75 = fStack_15c8;
                fVar76 = local_1600;
                fVar77 = fStack_15fc;
                fVar78 = fStack_15f8;
                fVar79 = fStack_15f4;
                fVar80 = fStack_15f0;
                fVar81 = fStack_15ec;
                fVar82 = fStack_15e8;
              }
              uVar23 = vptestmd_avx512vl(local_16a0,local_16a0);
              uVar23 = uVar23 & 0xf;
              auVar32 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              bVar13 = (bool)((byte)uVar23 & 1);
              auVar33._0_4_ =
                   (uint)bVar13 * auVar32._0_4_ | (uint)!bVar13 * *(int *)(local_1670.ray + 0x80);
              bVar13 = (bool)((byte)(uVar23 >> 1) & 1);
              auVar33._4_4_ =
                   (uint)bVar13 * auVar32._4_4_ | (uint)!bVar13 * *(int *)(local_1670.ray + 0x84);
              bVar13 = (bool)((byte)(uVar23 >> 2) & 1);
              auVar33._8_4_ =
                   (uint)bVar13 * auVar32._8_4_ | (uint)!bVar13 * *(int *)(local_1670.ray + 0x88);
              bVar13 = SUB81(uVar23 >> 3,0);
              auVar33._12_4_ =
                   (uint)bVar13 * auVar32._12_4_ | (uint)!bVar13 * *(int *)(local_1670.ray + 0x8c);
              *(undefined1 (*) [16])(local_1670.ray + 0x80) = auVar33;
              if ((byte)uVar23 != 0) goto LAB_01db50a6;
            }
            *(int *)(ray + k * 4 + 0x80) = auVar87._0_4_;
            local_1688 = local_1688 ^ 1L << (uVar26 & 0x3f);
          }
        } while (local_1688 != 0);
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }